

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O0

void __thiscall
cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemContext
          (MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this)

{
  MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  ~MemContext(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~MemContext()
    {
    }